

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_QuickSort3(word *pData,int nSize,int fDecrease)

{
  int local_1c;
  int fVerify;
  int i;
  int fDecrease_local;
  int nSize_local;
  word *pData_local;
  
  if (fDecrease == 0) {
    Abc_QuickSort2Inc_rec(pData,0,nSize + -1);
    for (local_1c = 1; local_1c < nSize; local_1c = local_1c + 1) {
      if ((uint)pData[local_1c] < (uint)pData[local_1c + -1]) {
        __assert_fail("(unsigned)pData[i-1] <= (unsigned)pData[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                      ,0x2b7,"void Abc_QuickSort3(word *, int, int)");
      }
    }
  }
  else {
    Abc_QuickSort2Dec_rec(pData,0,nSize + -1);
    for (local_1c = 1; local_1c < nSize; local_1c = local_1c + 1) {
      if ((uint)pData[local_1c + -1] < (uint)pData[local_1c]) {
        __assert_fail("(unsigned)pData[i-1] >= (unsigned)pData[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                      ,0x2b0,"void Abc_QuickSort3(word *, int, int)");
      }
    }
  }
  return;
}

Assistant:

void Abc_QuickSort3( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 1;
    if ( fDecrease )
    {
        Abc_QuickSort2Dec_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        Abc_QuickSort2Inc_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}